

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderSupplementalData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::Mode5TransponderSupplementalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5TransponderSupplementalData *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Mode 5 Transponder Supplemental Data:");
  poVar1 = std::operator<<(poVar1,"\n\tSquitter: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\n\tLevel 2 Squiter: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\n\tIFF Mission: ");
  poVar1 = std::operator<<(poVar1,(this->m_SupplementalDataUnion).m_ui8SupplementalData >> 2 & 7);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5TransponderSupplementalData::GetAsString() const
{
    KStringStream ss;	
	ss << "Mode 5 Transponder Supplemental Data:"
	   << "\n\tSquitter: "        << ( KBOOL )m_SupplementalDataUnion.m_ui8SquitterStatus 
	   << "\n\tLevel 2 Squiter: " << ( KBOOL )m_SupplementalDataUnion.m_ui8Lvl2SquitterStatus
	   << "\n\tIFF Mission: "     << m_SupplementalDataUnion.m_ui8IFFMission
	   << "\n";
    return ss.str();
}